

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_class.hpp
# Opt level: O0

void __thiscall libtorrent::peer_class_pool::peer_class_pool(peer_class_pool *this)

{
  peer_class_pool *this_local;
  
  libtorrent::aux::
  container_wrapper<libtorrent::peer_class,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::deque<libtorrent::peer_class,_std::allocator<libtorrent::peer_class>_>_>
  ::container_wrapper(&this->m_peer_classes);
  ::std::
  vector<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>_>_>
  ::vector(&this->m_free_list);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT peer_class_pool
	{
		peer_class_t new_peer_class(std::string label);
		void decref(peer_class_t c);
		void incref(peer_class_t c);
		peer_class* at(peer_class_t c);
		peer_class const* at(peer_class_t c) const;

	private:

		// state for peer classes (a peer can belong to multiple classes)
		// this can control
		aux::deque<peer_class, peer_class_t> m_peer_classes;

		// indices in m_peer_classes that are no longer used
		std::vector<peer_class_t> m_free_list;
	}